

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.h
# Opt level: O1

bool __thiscall
trieste::
Process<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::PassDef>_*,_std::vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>_>_>
::validate(Process<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::PassDef>_*,_std::vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>_>_>
           *this,Node *ast,Nodes *errors)

{
  NodeDef *this_00;
  bool bVar1;
  bool bVar2;
  Wellformed wf;
  Node local_60;
  Wellformed local_50;
  
  CLI::std::
  _Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>_>
  ::_Rb_tree((_Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>_>
              *)&local_50,
             (_Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>_>
              *)(this->pass_range).wf);
  if ((ast->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = trieste::wf::Wellformed::build_st(&local_50,ast);
  }
  this_00 = (ast->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this_00 != (NodeDef *)0x0) {
    NodeDef::get_errors(this_00,errors);
  }
  if ((bVar1 == false) ||
     ((errors->
      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (errors->
      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    bVar1 = false;
    bVar2 = false;
  }
  else if (this->check_well_formed == true) {
    local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ast->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (ast->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    bVar2 = trieste::wf::Wellformed::check(&local_50,&local_60);
    bVar1 = true;
  }
  else {
    bVar2 = true;
    bVar1 = false;
  }
  if ((bVar1) &&
     (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  std::
  _Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>_>
               *)&local_50);
  return bVar2;
}

Assistant:

bool validate(Node ast, Nodes& errors)
    {
      auto wf = pass_range.input_wf();
      auto ok = bool(ast);

      ok = ok && wf.build_st(ast);
      
      if (ast)
        ast->get_errors(errors);
      ok = ok && errors.empty();
      
      ok = ok && (!check_well_formed || wf.check(ast));

      return ok;
    }